

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O1

void __thiscall
docopt::BranchPattern::fix_identities(BranchPattern *this,UniquePatternSet *patterns)

{
  pointer psVar1;
  element_type *peVar2;
  UniquePatternSet *in_RAX;
  long *plVar3;
  __hashtable *__h;
  shared_ptr<docopt::Pattern> *child;
  pointer psVar4;
  pair<std::__detail::_Node_iterator<std::shared_ptr<docopt::Pattern>,_true,_true>,_bool> pVar5;
  UniquePatternSet *local_38;
  
  psVar4 = (this->fChildren).
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->fChildren).
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 != psVar1) {
    local_38 = in_RAX;
    do {
      peVar2 = (psVar4->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(peVar2,&Pattern::typeinfo,&typeinfo,0);
      }
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0x48))(plVar3,patterns);
      }
      local_38 = patterns;
      pVar5 = std::
              _Hashtable<std::shared_ptr<docopt::Pattern>,std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>,std::__detail::_Identity,docopt::PatternPointerEquality,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<std::shared_ptr<docopt::Pattern>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::shared_ptr<docopt::Pattern>,true>>>>
                        ((_Hashtable<std::shared_ptr<docopt::Pattern>,std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>,std::__detail::_Identity,docopt::PatternPointerEquality,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)patterns,psVar4,&local_38);
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        (psVar4->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             *(element_type **)
              ((long)pVar5.first.super__Node_iterator_base<std::shared_ptr<docopt::Pattern>,_true>.
                     _M_cur.super__Node_iterator_base<std::shared_ptr<docopt::Pattern>,_true> + 8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(psVar4->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)pVar5.first.
                          super__Node_iterator_base<std::shared_ptr<docopt::Pattern>,_true>._M_cur.
                          super__Node_iterator_base<std::shared_ptr<docopt::Pattern>,_true> + 0x10))
        ;
      }
      psVar4 = psVar4 + 1;
    } while (psVar4 != psVar1);
  }
  return;
}

Assistant:

virtual void fix_identities(UniquePatternSet& patterns) {
			for(auto& child : fChildren) {
				// this will fix up all its children, if needed
				if (auto bp = dynamic_cast<BranchPattern*>(child.get())) {
					bp->fix_identities(patterns);
				}

				// then we try to add it to the list
				auto inserted = patterns.insert(child);
				if (!inserted.second) {
					// already there? then reuse the existing shared_ptr for that thing
					child = *inserted.first;
				}
			}
		}